

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O1

void __thiscall
cpptrace::stacktrace::print_with_snippets
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  pointer psVar1;
  uint frame_number_width;
  size_t sVar2;
  undefined7 in_register_00000011;
  char *__s;
  pointer psVar3;
  size_t counter;
  string local_58;
  stacktrace *local_38;
  
  if ((int)CONCAT71(in_register_00000011,color) != 0) {
    if (stream == (ostream *)&std::cout) {
      ::isatty(stdout_fileno);
    }
    else if (stream == (ostream *)&std::cerr) {
      ::isatty(stderr_fileno);
    }
  }
  __s = "Stack trace (most recent call first):";
  if (header != (char *)0x0) {
    __s = header;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  psVar3 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 == psVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"<empty trace>",0xd);
    local_58._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  }
  else {
    frame_number_width =
         detail::n_digits((int)((ulong)((long)psVar1 - (long)psVar3) >> 5) * -0x55555555 - 1);
    psVar3 = (this->frames).
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->frames).
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 != psVar1) {
      counter = 0;
      local_38 = this;
      do {
        print_frame(stream,color,frame_number_width,counter,psVar3);
        if ((newline_at_end) ||
           (psVar3 != (local_38->frames).
                      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1)) {
          local_58._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
        }
        if (((psVar3->line).raw_value != 0xffffffff) && ((psVar3->filename)._M_string_length != 0))
        {
          detail::get_snippet(&local_58,&psVar3->filename,(ulong)(psVar3->line).raw_value,2,color);
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                             local_58._M_dataplus._M_p._0_1_),
                     local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
              &local_58.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_
                                    ),local_58.field_2._M_allocated_capacity + 1);
          }
        }
        counter = counter + 1;
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
    }
  }
  return;
}

Assistant:

void stacktrace::print_with_snippets(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>" << '\n';
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            if(frame.line.has_value() && !frame.filename.empty()) {
                stream << detail::get_snippet(frame.filename, frame.line.value(), 2, color);
            }
            counter++;
        }
    }